

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

Map * __thiscall MapLoader::readMapFile(MapLoader *this)

{
  bool *pbVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar5;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar6;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar7;
  string *mode;
  int *lineCount;
  istream *piVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pLineWords;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  reference __lhs;
  Map *pMVar10;
  MapLoader *this_00;
  undefined1 local_2b1;
  bool *local_2b0;
  int local_2a4;
  Map *local_2a0;
  int *local_298;
  int *local_290;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_288;
  value_type *local_280;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_278;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_270;
  int *local_268;
  string *local_260;
  string line;
  ifstream infile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&infile,(string *)this->pMapFile,_S_in);
  if (((abStack_218[*(long *)(_infile + -0x18)] & 5) == 0) &&
     (iVar3 = std::istream::peek(), iVar3 != -1)) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    psVar4 = (string *)operator_new(0x20);
    (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
    psVar4->_M_string_length = 0;
    (psVar4->field_2)._M_local_buf[0] = '\0';
    pvVar5 = (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)operator_new(0x18);
    (pvVar5->
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar5->
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar5->
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar6 = (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)operator_new(0x18);
    (pvVar6->
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar6->
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar6->
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar7 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)operator_new(0x18);
    (pvVar7->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar7->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar7->
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mode = (string *)operator_new(0x20);
    (mode->_M_dataplus)._M_p = (pointer)&mode->field_2;
    mode->_M_string_length = 0;
    (mode->field_2)._M_local_buf[0] = '\0';
    lineCount = (int *)operator_new(4);
    *lineCount = 0;
    local_268 = (int *)operator_new(4);
    *local_268 = 1;
    local_290 = (int *)operator_new(4);
    *local_290 = 0;
    local_298 = (int *)operator_new(4);
    *local_298 = 0;
    local_288 = pvVar7;
    local_278 = pvVar6;
    local_270 = pvVar5;
    local_260 = psVar4;
    local_2b0 = (bool *)operator_new(1);
    *local_2b0 = true;
    local_2a0 = (Map *)0x0;
    local_2a4 = 0;
    iVar3 = 0;
LAB_001159e6:
    iVar3 = iVar3 + 1;
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&infile,(string *)&line);
    pvVar6 = local_270;
    pvVar5 = local_278;
    pbVar1 = local_2b0;
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
      *lineCount = iVar3;
      pLineWords = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)operator_new(0x18);
      (pLineWords->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pLineWords->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pLineWords->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((line._M_string_length != 0) &&
         ((0x3b < (ulong)(byte)*line._M_dataplus._M_p ||
          ((0x800000000002400U >> ((ulong)(byte)*line._M_dataplus._M_p & 0x3f) & 1) == 0)))) {
        local_2b1 = 10;
        _Var9 = std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )line._M_dataplus._M_p,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(line._M_dataplus._M_p + line._M_string_length),
                           (_Iter_equals_val<const_char>)&local_2b1);
        std::__cxx11::string::erase
                  (&line,_Var9._M_current,line._M_dataplus._M_p + line._M_string_length);
        local_2b1 = 0xd;
        _Var9 = std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )line._M_dataplus._M_p,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(line._M_dataplus._M_p + line._M_string_length),
                           (_Iter_equals_val<const_char>)&local_2b1);
        psVar4 = &line;
        std::__cxx11::string::erase
                  (&line,_Var9._M_current,line._M_dataplus._M_p + line._M_string_length);
        splitLine((MapLoader *)psVar4,&line,pLineWords);
        getMapName((MapLoader *)psVar4,local_260,pLineWords);
        bVar2 = checkSection((MapLoader *)psVar4,mode,pLineWords);
        if (!bVar2) {
          bVar2 = std::operator==(mode,"files");
          if (!bVar2) {
            bVar2 = std::operator==(mode,"continents");
            if (bVar2) {
              local_2a4 = local_2a4 + 1;
              *local_290 = local_2a4;
              if ((ulong)((long)(pLineWords->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pLineWords->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                *local_2b0 = false;
                goto LAB_00115d50;
              }
              std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::push_back(local_270,pLineWords);
            }
            else {
              psVar4 = mode;
              bVar2 = std::operator==(mode,"countries");
              if (bVar2) {
                bVar2 = validateCountryLine((MapLoader *)psVar4,local_298,pLineWords,lineCount,
                                            local_2b0,local_268,local_290,false);
                if (!bVar2) goto LAB_00115d59;
                std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::push_back(local_278,pLineWords);
              }
              else {
                bVar2 = std::operator==(mode,"borders");
                if (bVar2) {
                  this_00 = (MapLoader *)0x18;
                  local_280 = (value_type *)operator_new(0x18);
                  (local_280->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  (local_280->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  (local_280->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  bVar2 = validateBordersLine(this_00,local_280,pLineWords,lineCount,local_2b0,
                                              local_298,false);
                  if (!bVar2) goto LAB_00115d59;
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::push_back(local_288,local_280);
                }
                else {
                  __lhs = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::at(pLineWords,0);
                  bVar2 = std::operator==(__lhs,"name");
                  if (bVar2) goto LAB_001159e6;
                }
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(pLineWords);
          operator_delete(pLineWords,0x18);
        }
      }
      goto LAB_001159e6;
    }
    local_2a0 = initMapObject(local_260,local_270,local_278,local_288,local_2b0);
    std::__cxx11::string::~string((string *)mode);
    operator_delete(mode,0x20);
    operator_delete(lineCount,4);
    operator_delete(local_290,4);
    operator_delete(local_298,4);
    operator_delete(local_268,4);
    pvVar7 = local_288;
    if ((((*pbVar1 == true) &&
         ((pvVar6->
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (pvVar6->
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) &&
        ((pvVar5->
         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start !=
         (pvVar5->
         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish)) &&
       ((local_288->
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (local_288->
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish)) {
      operator_delete(local_2b0,1);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(pvVar6);
      operator_delete(pvVar6,0x18);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(pvVar5);
      operator_delete(pvVar5,0x18);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(pvVar7);
      operator_delete(pvVar7,0x18);
    }
    else {
      operator_delete(local_2b0,1);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(pvVar6);
      operator_delete(pvVar6,0x18);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(pvVar5);
      operator_delete(pvVar5,0x18);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(pvVar7);
      operator_delete(pvVar7,0x18);
LAB_00115d50:
      local_2a0 = (Map *)0x0;
    }
LAB_00115d59:
    std::__cxx11::string::~string((string *)&line);
    pMVar10 = local_2a0;
  }
  else {
    pMVar10 = (Map *)0x0;
  }
  std::ifstream::~ifstream(&infile);
  return pMVar10;
}

Assistant:

Map* MapLoader::readMapFile() {
    //for debug purposes, change to true to print errors and warnings
    bool verbose = false;
    //create file stream to read file line by line
    std::ifstream infile(*pMapFile);
    if(!infile || infile.peek() == EOF){
        return nullptr;
    }
    std::string line;

    //declare map info
    auto* pMapName = new std::string;
    auto* pContinentData = new std::vector<std::vector<std::string>>;
    auto* pCountryData = new std::vector<std::vector<std::string>>;
    auto* pBorderData = new std::vector<std::vector<int>>;
    auto* pMode = new std::string;

    //maintain counters for validation / error tracing
    auto* pLineCount = new int(0);
    auto* pCountryID = new int(1);
    auto* pContinentCount = new int(0);
    auto* pCountryCount = new int(0);
    auto* pValidMap = new bool(true);

    while (std::getline(infile, line)) {
        (*pLineCount)++;
        //will hold the words of each line (separated by spaces) in an array
        auto* pLineWords = new std::vector<std::string>;
        //ignore comments or empty lines
        if (line.empty() || line[0] == *";" || line[0] == *"\n" || line[0] == *"\r") {
            //do nothing, the line is empty or is a comment
            continue;
        } else {
            // strip every line of the \n and \r characters
            line.erase(std::remove(line.begin(), line.end(), '\n'), line.end());
            line.erase(std::remove(line.begin(), line.end(), '\r'), line.end());
            splitLine(line, pLineWords);
            getMapName(pMapName, pLineWords);

            if (checkSection(pMode, pLineWords)) {
                continue;
            }

            //read sections
            if (*pMode == "files") {
                //this mode is in every example file, do we need it?
                if(verbose){
                    std::cout << "Line " << *pLineCount
                              << " - [WARNING] : the parser encountered the file mode, which is not supported at the moment.\n";
                }
            } else if (*pMode == "continents") {
                if (validateContinentLine(pContinentCount, pLineWords, pLineCount, pValidMap,verbose)) {
                    pContinentData->push_back(*pLineWords);
                } else {
                    return nullptr;
                }
            } else if (*pMode == "countries") {
                if (validateCountryLine(pCountryCount, pLineWords, pLineCount, pValidMap, pCountryID,
                                        pContinentCount,verbose)) {
                    pCountryData->push_back(*pLineWords);
                } else {
                    return nullptr;
                }
            } else if (*pMode == "borders") {
                auto* pLineNums = new std::vector<int>;
                if (validateBordersLine(pLineNums, pLineWords, pLineCount, pValidMap, pCountryCount,verbose)) {
                    pBorderData->push_back(*pLineNums);
                } else {
                    return nullptr;
                }
            } else if (pLineWords->at(0) == "name") {
                continue;
            } else {
                //unknown mode error, will be ignored, non-critical
                if(verbose){
                    std::cout << "\nLine " << *pLineCount << " - [WARNING] : the parser encountered an unknown mode. ";
                    std::cout << " ::  " << line;
                }
            }
        }
        delete (pLineWords);
    }
    //create map object

    auto* map = initMapObject(pMapName, pContinentData, pCountryData, pBorderData, pValidMap);

    //clean up
    delete (pMode);
    delete (pLineCount);
    delete (pContinentCount);
    delete (pCountryCount);
    delete (pCountryID);

    if(!*pValidMap || pContinentData->empty() || pCountryData->empty() || pBorderData->empty()){
        delete (pValidMap);
        delete (pContinentData);
        delete (pCountryData);
        delete (pBorderData);
        return nullptr;
    }
    delete (pValidMap);
    delete (pContinentData);
    delete (pCountryData);
    delete (pBorderData);
    return map;
}